

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

uint32_t crc32(uint32_t crc,void *buf,size_t size)

{
  uint uVar1;
  size_t sVar2;
  uint8_t *p;
  
  if (size != 0) {
    uVar1 = ~crc;
    sVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ crc32_tab[(byte)(""[*(byte *)((long)buf + sVar2)] ^ (byte)uVar1)];
      sVar2 = sVar2 + 1;
    } while (size != sVar2);
    crc = ~uVar1;
  }
  return crc;
}

Assistant:

uint32_t crc32(uint32_t crc, const void *buf, size_t size)
{
    const uint8_t *p;

    p = (uint8_t*)buf;
    crc = crc ^ ~0U;

    while (size--)
        crc = crc32_tab[(crc ^ BitReverseTable[*p++]) & 0xFF] ^ (crc >> 8);

  return crc ^ ~0U;
}